

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_vector.cpp
# Opt level: O2

void use_stl_vector(void)

{
  allocator_type local_61;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  titles;
  vector<int,_std::allocator<int>_> ratings;
  
  std::vector<int,_std::allocator<int>_>::vector(&ratings,5,(allocator_type *)&titles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&titles,5,&local_61);
  std::operator<<((ostream *)&std::cout,"Do the following:\nEnter ");
}

Assistant:

void use_stl_vector () {
    using std::vector;
    using std::cout;
    using std::cin;
    using std::string;

    const int NUM = 5;

    //  similar like typescript: var arr: Array<number>;
    vector<int> ratings(NUM);
    vector<string> titles(NUM);

    cout << "Do the following:\nEnter " << NUM << " book titles and your ratings(0-10).\n";

    int i;
    for(i = 0; i < NUM; i++) {
        cout << "Enter title #" << i + 1 << ":\n";
        getline(cin, titles[i]);
        cout << "Enter your ratings (0-10):\n";
        cin >> ratings[i];
        cin.get();
    }

    cout << "Done. You entered the following:\n";
    cout << "Rating\tBook\n";
    for(i = 0; i < NUM; i++) {
        cout << ratings[i] << "\t" << titles[i] << "\n";
    }
}